

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hdr_histogram.c
# Opt level: O2

void hdr_reset_internal_counters(hdr_histogram *h)

{
  ulong uVar1;
  int64_t iVar2;
  ulong uVar3;
  int iVar4;
  int index;
  ulong uVar5;
  long lVar6;
  
  uVar3 = 0;
  uVar1 = (ulong)(uint)h->counts_len;
  if (h->counts_len < 1) {
    uVar1 = uVar3;
  }
  uVar5 = 0xffffffffffffffff;
  lVar6 = 0;
  index = -1;
  for (; uVar1 != uVar3; uVar3 = uVar3 + 1) {
    if (0 < h->counts[uVar3]) {
      lVar6 = lVar6 + h->counts[uVar3];
      iVar4 = index;
      if (index == -1) {
        iVar4 = (int)uVar3;
      }
      if (uVar3 != 0) {
        index = iVar4;
      }
      uVar5 = uVar3 & 0xffffffff;
    }
  }
  if ((int)uVar5 == -1) {
    iVar2 = 0;
  }
  else {
    iVar2 = hdr_value_at_index(h,(int)uVar5);
    iVar2 = highest_equivalent_value(h,iVar2);
  }
  h->max_value = iVar2;
  if (index == -1) {
    iVar2 = 0x7fffffffffffffff;
  }
  else {
    iVar2 = hdr_value_at_index(h,index);
  }
  h->min_value = iVar2;
  h->total_count = lVar6;
  return;
}

Assistant:

void hdr_reset_internal_counters(struct hdr_histogram* h)
{
    int min_non_zero_index = -1;
    int max_index = -1;
    int64_t observed_total_count = 0;
    int i;

    for (i = 0; i < h->counts_len; i++)
    {
        int64_t count_at_index;

        if ((count_at_index = counts_get_direct(h, i)) > 0)
        {
            observed_total_count += count_at_index;
            max_index = i;
            if (min_non_zero_index == -1 && i != 0)
            {
                min_non_zero_index = i;
            }
        }
    }

    if (max_index == -1)
    {
        h->max_value = 0;
    }
    else
    {
        int64_t max_value = hdr_value_at_index(h, max_index);
        h->max_value = highest_equivalent_value(h, max_value);
    }

    if (min_non_zero_index == -1)
    {
        h->min_value = INT64_MAX;
    }
    else
    {
        h->min_value = hdr_value_at_index(h, min_non_zero_index);
    }

    h->total_count = observed_total_count;
}